

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOpaqueAttribute.cpp
# Opt level: O2

void __thiscall Imf_2_5::OpaqueAttribute::copyValueFrom(OpaqueAttribute *this,Attribute *other)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  TypeExc *this_00;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  lVar3 = __dynamic_cast(other,&Attribute::typeinfo,&typeinfo,0);
  if (lVar3 != 0) {
    bVar1 = std::operator!=(&this->_typeName,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar3 + 8));
    if (!bVar1) {
      Array<char>::resizeErase(&this->_data,*(long *)(lVar3 + 0x28));
      __n = *(size_t *)(lVar3 + 0x28);
      this->_dataSize = __n;
      memcpy((this->_data)._data,*(void **)(lVar3 + 0x38),__n);
      return;
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar4 = std::operator<<(local_190,"Cannot copy the value of an image file attribute of type \"");
  iVar2 = (*other->_vptr_Attribute[2])(other);
  poVar4 = std::operator<<(poVar4,(char *)CONCAT44(extraout_var,iVar2));
  poVar4 = std::operator<<(poVar4,"\" to an attribute of type \"");
  poVar4 = std::operator<<(poVar4,(string *)&this->_typeName);
  std::operator<<(poVar4,"\".");
  this_00 = (TypeExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::TypeExc::TypeExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_2_5::TypeExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void	
OpaqueAttribute::copyValueFrom (const Attribute &other)
{
    const OpaqueAttribute *oa = dynamic_cast <const OpaqueAttribute *> (&other);

    if (oa == 0 || _typeName != oa->_typeName)
    {
	THROW (IEX_NAMESPACE::TypeExc, "Cannot copy the value of an "
			     "image file attribute of type "
			     "\"" << other.typeName() << "\" "
			     "to an attribute of type "
			     "\"" << _typeName << "\".");
    }

    _data.resizeErase (oa->_dataSize);
    _dataSize = oa->_dataSize;
    memcpy ((char *) _data, (const char *) oa->_data, oa->_dataSize);
}